

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix * __thiscall maths::Matrix::operator*=(Matrix *this,Matrix *m)

{
  uint uVar1;
  double **ppdVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  Matrix temp;
  Matrix local_38;
  
  Matrix(&local_38,this->rows_,m->cols_);
  if (0 < (long)local_38.rows_) {
    uVar1 = this->cols_;
    lVar6 = 0;
    do {
      if (0 < local_38.cols_) {
        ppdVar2 = this->p;
        ppdVar3 = m->p;
        uVar7 = 0;
        do {
          if (0 < (int)uVar1) {
            pdVar4 = ppdVar2[lVar6];
            pdVar5 = local_38.p[lVar6];
            dVar9 = pdVar5[uVar7];
            uVar8 = 0;
            do {
              dVar9 = dVar9 + pdVar4[uVar8] * ppdVar3[uVar8][uVar7];
              pdVar5[uVar7] = dVar9;
              uVar8 = uVar8 + 1;
            } while (uVar1 != uVar8);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != (uint)local_38.cols_);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != local_38.rows_);
  }
  operator=(this,&local_38);
  ~Matrix(&local_38);
  return this;
}

Assistant:

Matrix& Matrix::operator*=(const Matrix& m)
{
    Matrix temp(rows_, m.cols_);
    for (int i = 0; i < temp.rows_; ++i) {
        for (int j = 0; j < temp.cols_; ++j) {
            for (int k = 0; k < cols_; ++k) {
                temp.p[i][j] += (p[i][k] * m.p[k][j]);
            }
        }
    }
    return (*this = temp);
}